

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_pixmap.cxx
# Opt level: O2

int fl_draw_pixmap(char **cdata,int x,int y,Fl_Color bg)

{
  uchar **ppuVar1;
  int iVar2;
  uchar *out;
  byte *pbVar3;
  uchar *puVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  int h;
  int w;
  uint local_34;
  
  iVar2 = fl_measure_pixmap(cdata,&w,&h);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    out = (uchar *)operator_new__((long)(w * h * 4));
    iVar2 = fl_convert_pixmap(cdata,out,bg);
    uVar10 = w;
    uVar9 = h;
    ppuVar1 = fl_mask_bitmap;
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      if (fl_mask_bitmap != (uchar **)0x0) {
        local_34 = y;
        pbVar3 = (byte *)operator_new__((long)(((w + 7) / 8) * h));
        *ppuVar1 = pbVar3;
        puVar4 = out + 3;
        uVar5 = uVar10;
        for (iVar2 = 0; y = local_34, iVar2 < (int)uVar9; iVar2 = iVar2 + 1) {
          bVar8 = 0;
          iVar7 = 1;
          for (iVar6 = 0; iVar6 < (int)uVar5; iVar6 = iVar6 + 1) {
            bVar8 = (char)*puVar4 >> 7 & (byte)iVar7 | bVar8;
            iVar7 = iVar7 * 2;
            if ((0x80 < iVar7) || (iVar6 == uVar5 - 1)) {
              *pbVar3 = bVar8;
              pbVar3 = pbVar3 + 1;
              bVar8 = 0;
              iVar7 = 1;
              uVar10 = w;
            }
            puVar4 = puVar4 + 4;
            uVar5 = uVar10;
          }
          uVar9 = h;
        }
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
                (fl_graphics_driver,out,x,(ulong)(uint)y,(ulong)uVar10,(ulong)uVar9,4,0);
      iVar2 = 1;
    }
    operator_delete__(out);
  }
  return iVar2;
}

Assistant:

int fl_draw_pixmap(const char*const* cdata, int x, int y, Fl_Color bg) {
  int w, h;

  if (!fl_measure_pixmap(cdata, w, h))
    return 0;

  uchar *buffer = new uchar[w*h*4];

  if (!fl_convert_pixmap(cdata, buffer, bg)) {
    delete[] buffer;
    return 0;
  }

  // FIXME: Hack until fl_draw_image() supports alpha properly
#ifdef  __APPLE_QUARTZ__
  if (Fl_Surface_Device::surface() == Fl_Display_Device::display_device()) {
    Fl_RGB_Image* rgb = new Fl_RGB_Image(buffer, w, h, 4);
    rgb->alloc_array = 1;
    rgb->draw(x, y);
    delete rgb;
    return 1;
  } else {
#endif // __APPLE_QUARTZ__
  // build the mask bitmap used by Fl_Pixmap:
  if (fl_mask_bitmap) {
    int W = (w+7)/8;
    uchar* bitmap = new uchar[W * h];
    *fl_mask_bitmap = bitmap;
    const uchar *p = &buffer[3];
    uchar b = 0;
    for (int Y = 0; Y < h; Y++) {
      b = 0;
      for (int X = 0, bit = 1; X < w; X++, p += 4) {
        if (*p > 127)
          b |= bit;
	    bit <<= 1;
        if (bit > 0x80 || X == w-1) {
	    *bitmap++ = b;
          bit = 1;
	    b = 0;
	  }
      } // if chars_per_pixel
    } // for Y
  }

  fl_draw_image(buffer, x, y, w, h, 4);

#ifdef __APPLE_QUARTZ__
  }
#endif
  delete[] buffer;
  return 1;
}